

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_error_alert::torrent_error_alert
          (torrent_error_alert *this,stack_allocator *alloc,torrent_handle *h,error_code *e,
          string_view f)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_error_alert_00460fc8;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  aVar4 = aux::stack_allocator::copy_string(alloc,f);
  (this->m_file_idx).m_idx = aVar4.m_idx;
  (this->error_file)._M_dataplus._M_p = (pointer)&(this->error_file).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->error_file,f.ptr_,f.ptr_ + f.len_);
  return;
}

Assistant:

torrent_error_alert::torrent_error_alert(
		aux::stack_allocator& alloc
		, torrent_handle const& h
		, error_code const& e, string_view f)
		: torrent_alert(alloc, h)
		, error(e)
		, m_file_idx(alloc.copy_string(f))
#if TORRENT_ABI_VERSION == 1
		, error_file(f)
#endif
	{}